

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O1

void __thiscall
QUntypedBindable::QUntypedBindable
          (QUntypedBindable *this,QObject *obj,char *property,QBindableInterface *i)

{
  char *pcVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  QString *pQVar5;
  QBindableInterface *pQVar6;
  QString *this_00;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QMetaProperty local_78;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (obj != (QObject *)0x0) {
    pQVar6 = i;
    iVar3 = (**obj->_vptr_QObject)(obj);
    iVar3 = QMetaObject::indexOfProperty((QMetaObject *)CONCAT44(extraout_var,iVar3),property);
    if (-1 < iVar3) {
      iVar4 = (**obj->_vptr_QObject)(obj);
      QMetaObject::property(&local_78,(QMetaObject *)CONCAT44(extraout_var_00,iVar4),iVar3);
      goto LAB_002c5ed2;
    }
    lcQPropertyBinding();
    if (((byte)lcQPropertyBinding::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
        != 0) {
      local_78.mobj._0_4_ = 2;
      local_78.mobj._4_4_ = 0;
      local_78.data.d._0_4_ = 0;
      local_78.data.d._4_4_ = 0;
      local_78.menum.mobj._0_4_ = 0;
      local_78.menum.mobj._4_4_ = 0;
      local_78.menum.data.d = (uint *)lcQPropertyBinding::category.name;
      QMessageLogger::warning((QMessageLogger *)local_58);
      uVar2 = local_58._0_8_;
      ba.m_data = (storage_type *)pQVar6;
      ba.m_size = (qsizetype)"QUntypedBindable: No property named";
      QString::fromUtf8((QString *)(local_58 + 8),(QString *)0x23,ba);
      ::QTextStream::operator<<((QTextStream *)uVar2,(QString *)(local_58 + 8));
      if ((QArrayData *)local_58._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_58._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_58._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_58._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_58._8_8_,2,0x10);
        }
      }
      if (*(bool *)(local_58._0_8_ + 0x30) == true) {
        ::QTextStream::operator<<((QTextStream *)local_58._0_8_,' ');
      }
      uVar2 = local_58._0_8_;
      if (property == (char *)0x0) {
        this_00 = (QString *)0x0;
      }
      else {
        pQVar5 = (QString *)0xffffffffffffffff;
        do {
          this_00 = (QString *)((long)&(pQVar5->d).d + 1);
          pcVar1 = property + 1 + (long)pQVar5;
          pQVar5 = this_00;
        } while (*pcVar1 != '\0');
      }
      ba_00.m_data = (storage_type *)pQVar6;
      ba_00.m_size = (qsizetype)property;
      QString::fromUtf8((QString *)(local_58 + 8),this_00,ba_00);
      ::QTextStream::operator<<((QTextStream *)uVar2,(QString *)(local_58 + 8));
      if ((QArrayData *)local_58._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_58._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_58._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_58._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_58._8_8_,2,0x10);
        }
      }
      if (*(bool *)(local_58._0_8_ + 0x30) == true) {
        ::QTextStream::operator<<((QTextStream *)local_58._0_8_,' ');
      }
      QDebug::~QDebug((QDebug *)local_58);
    }
  }
  local_78.menum.mobj._0_4_ = 0;
  local_78.menum.mobj._4_4_ = 0;
  local_78.menum.data.d = (uint *)0x0;
  local_78.mobj._0_4_ = 0;
  local_78.mobj._4_4_ = 0;
  local_78.data.d._0_4_ = 0;
  local_78.data.d._4_4_ = 0;
LAB_002c5ed2:
  QUntypedBindable(this,obj,&local_78,i);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QUntypedBindable::QUntypedBindable(QObject *obj, const char *property,
                                   const QtPrivate::QBindableInterface *i)
    : QUntypedBindable(
            obj,
            [=]() -> QMetaProperty {
                if (!obj)
                    return {};
                auto propertyIndex = obj->metaObject()->indexOfProperty(property);
                if (propertyIndex < 0) {
                    qCWarning(lcQPropertyBinding)
                            << "QUntypedBindable: No property named" << property;
                    return {};
                }
                return obj->metaObject()->property(propertyIndex);
            }(),
            i)
{
}